

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHullComputer.cpp
# Opt level: O2

bool __thiscall
cbtConvexHullInternal::mergeProjection
          (cbtConvexHullInternal *this,IntermediateHull *h0,IntermediateHull *h1,Vertex **c0,
          Vertex **c1)

{
  Vertex *pVVar1;
  Vertex *pVVar2;
  bool bVar3;
  Vertex *pVVar4;
  Vertex *pVVar5;
  Vertex *pVVar6;
  int iVar7;
  Vertex *pVVar8;
  int iVar9;
  int iVar10;
  int32_t iVar11;
  int iVar12;
  Vertex *pVVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  Vertex *pVVar17;
  Vertex *pVVar18;
  Vertex *pVVar19;
  int side;
  int iVar20;
  int iVar21;
  
  pVVar13 = h0->maxYx;
  pVVar8 = h1->minYx;
  if (((pVVar13->point).x == (pVVar8->point).x) && ((pVVar13->point).y == (pVVar8->point).y)) {
    pVVar1 = pVVar8->prev;
    if (pVVar1 == pVVar8) {
      *c0 = pVVar13;
      if (pVVar8->edges != (Edge *)0x0) {
        pVVar8 = pVVar8->edges->target;
      }
      bVar3 = false;
      goto LAB_00e15c85;
    }
    pVVar13 = pVVar8->next;
    pVVar1->next = pVVar13;
    pVVar13->prev = pVVar1;
    if (pVVar8 == h1->minXy) {
      iVar7 = (pVVar1->point).x;
      iVar20 = (pVVar13->point).x;
      pVVar17 = pVVar13;
      if ((iVar7 <= iVar20) && ((iVar20 != iVar7 || ((pVVar1->point).y <= (pVVar13->point).y)))) {
        pVVar17 = pVVar1;
      }
      h1->minXy = pVVar17;
    }
    if (pVVar8 == h1->maxXy) {
      iVar7 = (pVVar1->point).x;
      iVar20 = (pVVar13->point).x;
      if ((iVar20 <= iVar7) && ((iVar20 != iVar7 || ((pVVar13->point).y <= (pVVar1->point).y)))) {
        pVVar13 = pVVar1;
      }
      h1->maxXy = pVVar13;
    }
  }
  pVVar13 = h0->minXy;
  pVVar1 = h0->maxXy;
  pVVar17 = h1->minXy;
  iVar7 = 1;
  pVVar8 = (Vertex *)0x0;
  pVVar6 = (Vertex *)0x0;
  pVVar2 = h1->maxXy;
  pVVar4 = pVVar2;
  pVVar19 = pVVar1;
  for (iVar20 = 0; iVar20 != 2; iVar20 = iVar20 + 1) {
    iVar15 = (pVVar19->point).x;
    iVar9 = ((pVVar4->point).x - iVar15) * iVar7;
    pVVar18 = pVVar19;
    if (0 < iVar9) {
      do {
        pVVar5 = pVVar4;
        iVar15 = (pVVar5->point).y;
        iVar12 = iVar9;
        while( true ) {
          iVar9 = (pVVar18->point).y;
          pVVar4 = (&pVVar18->next)[iVar20 == 0];
          iVar21 = iVar15 - iVar9;
          if ((pVVar4 == pVVar18) ||
             (iVar14 = (pVVar4->point).y, iVar10 = iVar14 - iVar9, iVar10 != 0 && iVar9 <= iVar14))
          break;
          iVar9 = (pVVar4->point).x;
          iVar14 = (iVar9 - (pVVar18->point).x) * iVar7;
          if ((iVar14 != 0) && ((-1 < iVar14 || (iVar14 * iVar21 < iVar10 * iVar12)))) break;
          iVar12 = ((pVVar5->point).x - iVar9) * iVar7;
          pVVar18 = pVVar4;
        }
        pVVar4 = (&pVVar5->next)[iVar20 == 0];
        if (pVVar4 == pVVar5) goto LAB_00e15c01;
        iVar14 = (pVVar4->point).x;
        iVar9 = (iVar14 - (pVVar18->point).x) * iVar7;
        if ((iVar9 < 1) || (iVar15 = (pVVar4->point).y - iVar15, -1 < iVar15)) goto LAB_00e15c01;
        iVar14 = (iVar14 - (pVVar5->point).x) * iVar7;
        if ((iVar14 != 0) && ((-1 < iVar14 || (iVar14 * iVar21 <= iVar15 * iVar12))))
        goto LAB_00e15c01;
      } while( true );
    }
    if (iVar9 < 0) {
      pVVar5 = pVVar4;
LAB_00e15b4a:
      iVar15 = (pVVar5->point).y;
      pVVar4 = (&pVVar5->next)[iVar20 != 0];
      pVVar19 = pVVar18;
      do {
        iVar21 = iVar9;
        pVVar18 = pVVar19;
        iVar12 = (pVVar18->point).y;
        iVar14 = iVar15 - iVar12;
        if ((pVVar4 != pVVar5) && (iVar9 = (pVVar4->point).y - iVar15, -1 < iVar9)) {
          iVar10 = (pVVar4->point).x;
          iVar16 = (iVar10 - (pVVar5->point).x) * iVar7;
          if ((iVar16 == 0) || ((iVar16 < 0 && (iVar9 * iVar21 <= iVar16 * iVar14))))
          goto LAB_00e15be0;
        }
        pVVar19 = (&pVVar18->next)[iVar20 != 0];
        if (pVVar19 == pVVar18) goto LAB_00e15c01;
        iVar10 = (pVVar19->point).x;
        iVar9 = ((pVVar5->point).x - iVar10) * iVar7;
        if ((-1 < iVar9) || (iVar12 = (pVVar19->point).y - iVar12, iVar12 < 1)) goto LAB_00e15c01;
        iVar10 = (iVar10 - (pVVar18->point).x) * iVar7;
        if ((iVar10 != 0) && ((-1 < iVar10 || (iVar10 * iVar14 <= iVar12 * iVar21))))
        goto LAB_00e15c01;
      } while( true );
    }
    pVVar5 = pVVar19;
    iVar11 = (pVVar19->point).y;
    do {
      pVVar18 = pVVar5;
      pVVar5 = (&pVVar18->next)[iVar20 == 0];
      if ((pVVar5 == pVVar19) || ((pVVar5->point).x != iVar15)) break;
      iVar9 = (pVVar5->point).y;
      bVar3 = iVar9 <= iVar11;
      iVar11 = iVar9;
    } while (bVar3);
    pVVar19 = pVVar4;
    iVar11 = (pVVar4->point).y;
    do {
      pVVar5 = pVVar19;
      pVVar19 = (&pVVar5->next)[iVar20 != 0];
      if ((pVVar19 == pVVar4) || ((pVVar19->point).x != iVar15)) break;
      iVar9 = (pVVar19->point).y;
      bVar3 = iVar11 <= iVar9;
      iVar11 = iVar9;
    } while (bVar3);
LAB_00e15c01:
    pVVar19 = pVVar18;
    pVVar4 = pVVar5;
    if (iVar20 == 0) {
      iVar7 = -1;
      pVVar6 = pVVar18;
      pVVar8 = pVVar5;
      pVVar19 = pVVar13;
      pVVar4 = pVVar17;
    }
  }
  pVVar19->prev = pVVar4;
  pVVar4->next = pVVar19;
  pVVar6->next = pVVar8;
  pVVar8->prev = pVVar6;
  if ((pVVar17->point).x < (pVVar13->point).x) {
    h0->minXy = pVVar17;
  }
  if ((pVVar1->point).x <= (pVVar2->point).x) {
    h0->maxXy = pVVar2;
  }
  h0->maxYx = h1->maxYx;
  bVar3 = true;
  *c0 = pVVar6;
LAB_00e15c85:
  *c1 = pVVar8;
  return bVar3;
LAB_00e15be0:
  iVar9 = (iVar10 - (pVVar18->point).x) * iVar7;
  pVVar5 = pVVar4;
  goto LAB_00e15b4a;
}

Assistant:

bool cbtConvexHullInternal::mergeProjection(IntermediateHull& h0, IntermediateHull& h1, Vertex*& c0, Vertex*& c1)
{
	Vertex* v0 = h0.maxYx;
	Vertex* v1 = h1.minYx;
	if ((v0->point.x == v1->point.x) && (v0->point.y == v1->point.y))
	{
		cbtAssert(v0->point.z < v1->point.z);
		Vertex* v1p = v1->prev;
		if (v1p == v1)
		{
			c0 = v0;
			if (v1->edges)
			{
				cbtAssert(v1->edges->next == v1->edges);
				v1 = v1->edges->target;
				cbtAssert(v1->edges->next == v1->edges);
			}
			c1 = v1;
			return false;
		}
		Vertex* v1n = v1->next;
		v1p->next = v1n;
		v1n->prev = v1p;
		if (v1 == h1.minXy)
		{
			if ((v1n->point.x < v1p->point.x) || ((v1n->point.x == v1p->point.x) && (v1n->point.y < v1p->point.y)))
			{
				h1.minXy = v1n;
			}
			else
			{
				h1.minXy = v1p;
			}
		}
		if (v1 == h1.maxXy)
		{
			if ((v1n->point.x > v1p->point.x) || ((v1n->point.x == v1p->point.x) && (v1n->point.y > v1p->point.y)))
			{
				h1.maxXy = v1n;
			}
			else
			{
				h1.maxXy = v1p;
			}
		}
	}

	v0 = h0.maxXy;
	v1 = h1.maxXy;
	Vertex* v00 = NULL;
	Vertex* v10 = NULL;
	int32_t sign = 1;

	for (int side = 0; side <= 1; side++)
	{
		int32_t dx = (v1->point.x - v0->point.x) * sign;
		if (dx > 0)
		{
			while (true)
			{
				int32_t dy = v1->point.y - v0->point.y;

				Vertex* w0 = side ? v0->next : v0->prev;
				if (w0 != v0)
				{
					int32_t dx0 = (w0->point.x - v0->point.x) * sign;
					int32_t dy0 = w0->point.y - v0->point.y;
					if ((dy0 <= 0) && ((dx0 == 0) || ((dx0 < 0) && (dy0 * dx <= dy * dx0))))
					{
						v0 = w0;
						dx = (v1->point.x - v0->point.x) * sign;
						continue;
					}
				}

				Vertex* w1 = side ? v1->next : v1->prev;
				if (w1 != v1)
				{
					int32_t dx1 = (w1->point.x - v1->point.x) * sign;
					int32_t dy1 = w1->point.y - v1->point.y;
					int32_t dxn = (w1->point.x - v0->point.x) * sign;
					if ((dxn > 0) && (dy1 < 0) && ((dx1 == 0) || ((dx1 < 0) && (dy1 * dx < dy * dx1))))
					{
						v1 = w1;
						dx = dxn;
						continue;
					}
				}

				break;
			}
		}
		else if (dx < 0)
		{
			while (true)
			{
				int32_t dy = v1->point.y - v0->point.y;

				Vertex* w1 = side ? v1->prev : v1->next;
				if (w1 != v1)
				{
					int32_t dx1 = (w1->point.x - v1->point.x) * sign;
					int32_t dy1 = w1->point.y - v1->point.y;
					if ((dy1 >= 0) && ((dx1 == 0) || ((dx1 < 0) && (dy1 * dx <= dy * dx1))))
					{
						v1 = w1;
						dx = (v1->point.x - v0->point.x) * sign;
						continue;
					}
				}

				Vertex* w0 = side ? v0->prev : v0->next;
				if (w0 != v0)
				{
					int32_t dx0 = (w0->point.x - v0->point.x) * sign;
					int32_t dy0 = w0->point.y - v0->point.y;
					int32_t dxn = (v1->point.x - w0->point.x) * sign;
					if ((dxn < 0) && (dy0 > 0) && ((dx0 == 0) || ((dx0 < 0) && (dy0 * dx < dy * dx0))))
					{
						v0 = w0;
						dx = dxn;
						continue;
					}
				}

				break;
			}
		}
		else
		{
			int32_t x = v0->point.x;
			int32_t y0 = v0->point.y;
			Vertex* w0 = v0;
			Vertex* t;
			while (((t = side ? w0->next : w0->prev) != v0) && (t->point.x == x) && (t->point.y <= y0))
			{
				w0 = t;
				y0 = t->point.y;
			}
			v0 = w0;

			int32_t y1 = v1->point.y;
			Vertex* w1 = v1;
			while (((t = side ? w1->prev : w1->next) != v1) && (t->point.x == x) && (t->point.y >= y1))
			{
				w1 = t;
				y1 = t->point.y;
			}
			v1 = w1;
		}

		if (side == 0)
		{
			v00 = v0;
			v10 = v1;

			v0 = h0.minXy;
			v1 = h1.minXy;
			sign = -1;
		}
	}

	v0->prev = v1;
	v1->next = v0;

	v00->next = v10;
	v10->prev = v00;

	if (h1.minXy->point.x < h0.minXy->point.x)
	{
		h0.minXy = h1.minXy;
	}
	if (h1.maxXy->point.x >= h0.maxXy->point.x)
	{
		h0.maxXy = h1.maxXy;
	}

	h0.maxYx = h1.maxYx;

	c0 = v00;
	c1 = v10;

	return true;
}